

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyusdz.cc
# Opt level: O2

bool tinyusdz::LoadUSDALayerFromMemory
               (uint8_t *addr,size_t length,string *asset_name,Layer *dst_layer,string *warn,
               string *err,USDLoadOptions *options)

{
  bool bVar1;
  ssize_t sVar2;
  Layer *__nbytes;
  USDAReader reader;
  USDAReaderConfig local_166c;
  string local_1668;
  StreamReader sr;
  Layer layer;
  
  if (((addr == (uint8_t *)0x0) || (length < 9)) || (dst_layer == (Layer *)0x0)) {
    if (err != (string *)0x0) {
      ::std::__cxx11::string::append((char *)err);
    }
    bVar1 = false;
  }
  else {
    sr.swap_endian_ = false;
    sr.idx_ = 0;
    __nbytes = dst_layer;
    sr.binary_ = addr;
    sr.length_ = length;
    usda::USDAReader::USDAReader(&reader,&sr);
    local_166c.allow_unknown_prims = true;
    local_166c.allow_unknown_shader = true;
    local_166c.allow_unknown_apiSchema = true;
    local_166c.strict_allowedToken_check = options->strict_allowedToken_check;
    usda::USDAReader::set_reader_config(&reader,&local_166c);
    sVar2 = usda::USDAReader::read(&reader,1,(void *)0x1,(size_t)__nbytes);
    if ((char)sVar2 == '\0') {
      if (err != (string *)0x0) {
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_1668,"Failed to parse USDA: ",asset_name);
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&layer
                         ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &local_1668,"\n");
        ::std::__cxx11::string::append((string *)err);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        usda::USDAReader::get_error_abi_cxx11_(&local_1668,&reader);
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&layer
                         ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &local_1668,"\n");
        ::std::__cxx11::string::append((string *)err);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
      }
      bVar1 = false;
    }
    else {
      Layer::Layer(&layer);
      bVar1 = usda::USDAReader::get_as_layer(&reader,&layer);
      if (bVar1) {
        if (warn != (string *)0x0) {
          usda::USDAReader::get_warning_abi_cxx11_(&local_1668,&reader);
          ::std::__cxx11::string::_M_dispose();
          if (local_1668._M_string_length != 0) {
            usda::USDAReader::get_warning_abi_cxx11_(&local_1668,&reader);
            ::std::__cxx11::string::append((string *)warn);
            ::std::__cxx11::string::_M_dispose();
          }
        }
        Layer::operator=(dst_layer,&layer);
      }
      else if (err != (string *)0x0) {
        usda::USDAReader::get_error_abi_cxx11_(&local_1668,&reader);
        ::std::__cxx11::string::append((string *)err);
        ::std::__cxx11::string::_M_dispose();
      }
      Layer::~Layer(&layer);
    }
    usda::USDAReader::~USDAReader(&reader);
  }
  return bVar1;
}

Assistant:

bool LoadUSDALayerFromMemory(const uint8_t *addr, const size_t length,
                       const std::string &asset_name, Layer *dst_layer,
                       std::string *warn, std::string *err,
                       const USDLoadOptions &options) {

  // TODO: options
  (void)options;

  if (!addr) {
    if (err) {
      (*err) += "addr arg is nullptr.\n";
    }
    return false;
  }

  if (length < 9) {
    if (err) {
      (*err) += "Input too short.\n";
    }
    return false;
  }

  if (!dst_layer) {
    if (err) {
      (*err) += "dst_layher arg is nullptr.\n";
    }
    return false;
  }

  tinyusdz::StreamReader sr(addr, length, /* swap endian */ false);
  tinyusdz::usda::USDAReader reader(&sr);

  tinyusdz::usda::USDAReaderConfig config;
  config.strict_allowedToken_check = options.strict_allowedToken_check;
  reader.set_reader_config(config);

  uint32_t load_states = static_cast<uint32_t>(tinyusdz::LoadState::Toplevel);

  bool as_primspec = true;

  {
    bool ret = reader.read(load_states, as_primspec);

    if (!ret) {
      if (err) {
        (*err) += "Failed to parse USDA: " + asset_name + "\n";
        (*err) += reader.get_error() + "\n";
      }
      return false;
    }
  }

  tinyusdz::Layer layer;
  bool ret = reader.get_as_layer(&layer);
  if (!ret) {
    if (err) {
      (*err) += reader.get_error();
    }
    return false;
  }

  if (warn) {
    if (reader.get_warning().size()) {
      (*warn) += reader.get_warning();
    }
  }

  (*dst_layer) = std::move(layer);

  return true;
}